

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

void __thiscall
crnlib::mipmapped_texture::set_orientation_flags(mipmapped_texture *this,orientation_flags_t flags)

{
  uint uVar1;
  vector<crnlib::mip_level_*> *pvVar2;
  mip_level **ppmVar3;
  uint local_1c;
  uint local_18;
  uint m;
  uint l;
  orientation_flags_t flags_local;
  mipmapped_texture *this_local;
  
  local_18 = 0;
  while( true ) {
    uVar1 = vector<crnlib::vector<crnlib::mip_level_*>_>::size(&this->m_faces);
    if (uVar1 <= local_18) break;
    local_1c = 0;
    while( true ) {
      pvVar2 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&this->m_faces,local_18);
      uVar1 = vector<crnlib::mip_level_*>::size(pvVar2);
      if (uVar1 <= local_1c) break;
      pvVar2 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&this->m_faces,local_18);
      ppmVar3 = vector<crnlib::mip_level_*>::operator[](pvVar2,local_1c);
      mip_level::set_orientation_flags(*ppmVar3,flags);
      local_1c = local_1c + 1;
    }
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void mipmapped_texture::set_orientation_flags(orientation_flags_t flags) {
  for (uint l = 0; l < m_faces.size(); l++)
    for (uint m = 0; m < m_faces[l].size(); m++)
      m_faces[l][m]->set_orientation_flags(flags);
}